

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall World::World(World *this,string *input_file)

{
  pointer ppPVar1;
  Primitive *primitive;
  vector<int4,_std::allocator<int4>_> *meshes;
  vector<Vector3,_std::allocator<Vector3>_> *points;
  World *pWVar2;
  bool bVar3;
  istream *piVar4;
  Sphere *this_00;
  Plane *this_01;
  Bezier *this_02;
  Light *this_03;
  ostream *poVar5;
  pointer ppPVar6;
  Primitive *new_primitive;
  vector<int4,_std::allocator<int4>_> *local_470;
  vector<Vector3,_std::allocator<Vector3>_> *local_468;
  World *local_460;
  vector<Primitive_*,_std::allocator<Primitive_*>_> *local_458;
  Camera *local_450;
  Vector3 *local_448;
  string var;
  string order;
  string obj;
  string local_3e0;
  string type;
  ifstream fin;
  
  local_450 = &this->camera;
  Camera::Camera(local_450);
  (this->bgc).x = 0.0;
  (this->bgc).y = 0.0;
  (this->bgc).z = 0.0;
  (this->points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meshes).super__Vector_base<int4,_std::allocator<int4>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->meshes).super__Vector_base<int4,_std::allocator<int4>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->meshes).super__Vector_base<int4,_std::allocator<int4>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->SHADE_QUALITY = 4;
  bVar3 = std::operator==(input_file,"");
  if (!bVar3) {
    local_468 = &this->points;
    local_470 = &this->meshes;
    local_458 = &this->pris;
    std::ifstream::ifstream(&fin,(input_file->_M_dataplus)._M_p,_S_in);
    obj._M_dataplus._M_p = (pointer)&obj.field_2;
    obj._M_string_length = 0;
    local_448 = &this->bgc;
    obj.field_2._M_local_buf[0] = '\0';
    local_460 = this;
LAB_0010e7dd:
    piVar4 = std::operator>>((istream *)&fin,(string *)&obj);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      new_primitive = (Primitive *)0x0;
      bVar3 = std::operator==(&obj,"primitive");
      if (bVar3) {
        type._M_dataplus._M_p = (pointer)&type.field_2;
        type._M_string_length = 0;
        type.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&fin,(string *)&type);
        bVar3 = std::operator==(&type,"sphere");
        if (bVar3) {
          this_00 = (Sphere *)operator_new(0xd0);
          Sphere::Sphere(this_00);
          new_primitive = (Primitive *)this_00;
        }
        bVar3 = std::operator==(&type,"plane");
        if (bVar3) {
          this_01 = (Plane *)operator_new(0xf0);
          Plane::Plane(this_01);
          new_primitive = (Primitive *)this_01;
        }
        bVar3 = std::operator==(&type,"bezier");
        if (bVar3) {
          this_02 = (Bezier *)operator_new(400);
          Bezier::Bezier(this_02);
          new_primitive = (Primitive *)this_02;
LAB_0010e98c:
          std::vector<Primitive_*,_std::allocator<Primitive_*>_>::push_back
                    (local_458,&new_primitive);
        }
        else if (new_primitive != (Primitive *)0x0) goto LAB_0010e98c;
        std::__cxx11::string::~string((string *)&type);
        goto LAB_0010e9a1;
      }
      bVar3 = std::operator==(&obj,"light");
      if (bVar3) {
        type._M_dataplus._M_p = (pointer)&type.field_2;
        type._M_string_length = 0;
        type.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&fin,(string *)&type);
        this_03 = (Light *)operator_new(0x68);
        Light::Light(this_03);
        local_460->light = this_03;
        std::__cxx11::string::~string((string *)&type);
        goto LAB_0010e9a4;
      }
      bVar3 = std::operator==(&obj,"end");
      if (!bVar3) goto code_r0x0010e959;
    }
    pWVar2 = local_460;
    ppPVar1 = (local_460->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppPVar6 = (local_460->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; points = local_468, meshes = local_470,
        ppPVar6 != ppPVar1; ppPVar6 = ppPVar6 + 1) {
      primitive = *ppPVar6;
      (*primitive->_vptr_Primitive[1])(primitive);
      (*primitive->_vptr_Primitive[4])(primitive,local_468,local_470);
      poVar5 = operator<<((ostream *)&std::cout,primitive);
      std::operator<<(poVar5,'\n');
    }
    Camera::generateMeshes(local_450,local_468,local_470);
    Light::generateMeshes(pWVar2->light,points,meshes);
    std::__cxx11::string::~string((string *)&obj);
    std::ifstream::~ifstream(&fin);
  }
  return;
code_r0x0010e959:
  bVar3 = std::operator!=(&obj,"background");
  if ((!bVar3) || (bVar3 = std::operator!=(&obj,"camera"), !bVar3)) {
LAB_0010e9a1:
    this_03 = (Light *)0x0;
LAB_0010e9a4:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&obj);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::istream::ignore((long)&fin,0x400);
    order._M_dataplus._M_p = (pointer)&order.field_2;
    order._M_string_length = 0;
    order.field_2._M_local_buf[0] = '\0';
    while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&fin,(string *)&order,'\n'),
          ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&type,(string *)&order,_S_out|_S_in);
      var._M_dataplus._M_p = (pointer)&var.field_2;
      var._M_string_length = 0;
      var.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)&type,(string *)&var);
      bVar3 = std::operator==(&var,"end");
      if (bVar3) {
        std::__cxx11::string::~string((string *)&var);
        std::__cxx11::stringstream::~stringstream((stringstream *)&type);
        break;
      }
      bVar3 = std::operator==(&obj,"background");
      if (bVar3) {
        operator>>((stringstream *)&type,local_448);
      }
      bVar3 = std::operator==(&obj,"primitive");
      if (new_primitive != (Primitive *)0x0 && bVar3) {
        (*new_primitive->_vptr_Primitive[3])(new_primitive,&var,&type);
      }
      bVar3 = std::operator==(&obj,"light");
      if ((this_03 != (Light *)0x0) && (bVar3)) {
        std::__cxx11::string::string((string *)&local_3e0,(string *)&var);
        Light::input(this_03,&local_3e0,(stringstream *)&type);
        std::__cxx11::string::~string((string *)&local_3e0);
      }
      bVar3 = std::operator==(&obj,"camera");
      if (bVar3) {
        Camera::input(local_450,&var,(stringstream *)&type);
      }
      std::__cxx11::string::~string((string *)&var);
      std::__cxx11::stringstream::~stringstream((stringstream *)&type);
    }
    std::__cxx11::string::~string((string *)&order);
  }
  goto LAB_0010e7dd;
}

Assistant:

World::World(std::string input_file) {
    SHADE_QUALITY = 4;
    if ( input_file == "" ) return;
    std::ifstream fin( input_file.c_str() );

    std::string obj;
    while ( fin >> obj ) {
        Primitive* new_primitive = NULL;
        Light* new_light = NULL;

        if ( obj == "primitive" ) {
            std::string type;
            fin >> type;
            if (type == "sphere") new_primitive = new Sphere;
            if (type == "plane" ) new_primitive = new Plane;
            if (type == "bezier") new_primitive = new Bezier;
            if (new_primitive != NULL) pris.push_back(new_primitive);
        }
//            if ( type == "rectangle" ) new_primitive = new Rectangle;
//            if ( type == "triangle" ) new_primitive = new Triangle;
//            if ( type == "polyhedron" ) new_primitive = new Polyhedron;
//            AddPrimitive( new_primitive );
//        }
        else
        if ( obj == "light" ) {
            std::string type; fin >> type;
            new_light = new Light;
//            if ( type == "point" ) new_light = new PointLight;
//            if ( type == "area" ) new_light = new AreaLight;
//            AddLight( new_light );
            light = new_light;
        } else
        if (obj == "end") break;
        else if ( obj != "background" && obj != "camera" ) continue;
        std::cout << obj << std::endl;

        fin.ignore( 1024 , '\n' );

        std::string order;
        while ( std::getline( fin , order , '\n' ) ) {
            std::stringstream fin2( order );
            std::string var; fin2 >> var;
            if ( var == "end" ) {
                //if (obj == "primitive" && new_primitive != NULL) new_primitive->PreTreatment();
                break;
            }

            if ( obj == "background") fin2 >> bgc;
            if ( obj == "primitive" && new_primitive != NULL ) new_primitive->input( var , fin2 );
            if ( obj == "light" && new_light != NULL ) new_light->input( var , fin2 );
            if ( obj == "camera" ) camera.input( var , fin2 );
        }
    }
    for (auto i : pris) {
        i->init();
        i->generateMeshes(points, meshes);
        std::cout << *i << '\n';
    }
    camera.generateMeshes(points, meshes);
    light->generateMeshes(points, meshes);
}